

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::TexImage3DParamsCase::createTexture(TexImage3DParamsCase *this)

{
  ContextWrapper *this_00;
  TextureFormat *this_01;
  TextureFormatInfo *b;
  int iVar1;
  int iVar2;
  int iVar3;
  uint rowPitch;
  deUint32 tex;
  TransferFormat local_e0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  Vec4 colorB;
  Vec4 cBias;
  Vec4 cScale;
  PixelBufferAccess local_80;
  Vec4 colorA;
  Vector<float,_4> local_48;
  
  this_01 = &(this->super_Texture3DSpecCase).m_texFormat;
  local_e0 = glu::getTransferFormat((this->super_Texture3DSpecCase).m_texFormat);
  iVar1 = tcu::TextureFormat::getPixelSize(this_01);
  iVar3 = this->m_imageHeight;
  iVar2 = this->m_rowLength;
  if (iVar2 < 1) {
    iVar2 = (this->super_Texture3DSpecCase).m_width;
  }
  rowPitch = -this->m_alignment & (iVar2 * iVar1 + this->m_alignment) - 1U;
  if (iVar3 < 1) {
    iVar3 = (this->super_Texture3DSpecCase).m_height;
  }
  iVar3 = iVar3 * rowPitch;
  tex = 0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&data,(long)(int)(((this->super_Texture3DSpecCase).m_depth + this->m_skipImages) *
                               iVar3 + this->m_skipPixels * iVar1 + this->m_skipRows * rowPitch));
  b = &(this->super_Texture3DSpecCase).m_texFormatInfo;
  tcu::operator-((tcu *)&cScale,&(this->super_Texture3DSpecCase).m_texFormatInfo.valueMax,
                 &b->valueMin);
  tcu::Vector<float,_4>::Vector(&cBias,&b->valueMin);
  colorB.m_data[0] = 1.0;
  colorB.m_data[1] = 0.0;
  colorB.m_data[2] = 0.0;
  colorB.m_data[3] = 1.0;
  tcu::operator*((tcu *)&local_80,&colorB,&cScale);
  tcu::operator+((tcu *)&colorA,(Vector<float,_4> *)&local_80,&cBias);
  local_48.m_data[0] = 0.0;
  local_48.m_data[1] = 1.0;
  local_48.m_data[2] = 0.0;
  local_48.m_data[3] = 1.0;
  tcu::operator*((tcu *)&local_80,&local_48,&cScale);
  tcu::operator+((tcu *)&colorB,(Vector<float,_4> *)&local_80,&cBias);
  tcu::PixelBufferAccess::PixelBufferAccess
            (&local_80,this_01,(this->super_Texture3DSpecCase).m_width,
             (this->super_Texture3DSpecCase).m_height,(this->super_Texture3DSpecCase).m_depth,
             rowPitch,iVar3,
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start +
             (long)(iVar1 * this->m_skipPixels) + (long)(int)(this->m_skipRows * rowPitch) +
             (long)(this->m_skipImages * iVar3));
  tcu::fillWithGrid(&local_80,4,&colorA,&colorB);
  this_00 = &(this->super_Texture3DSpecCase).super_TextureSpecCase.super_ContextWrapper;
  sglr::ContextWrapper::glPixelStorei(this_00,0x806e,this->m_imageHeight);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf2,this->m_rowLength);
  sglr::ContextWrapper::glPixelStorei(this_00,0x806d,this->m_skipImages);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf3,this->m_skipRows);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf4,this->m_skipPixels);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,this->m_alignment);
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0x806f,tex);
  sglr::ContextWrapper::glTexImage3D
            (this_00,0x806f,0,this->m_internalFormat,(this->super_Texture3DSpecCase).m_width,
             (this->super_Texture3DSpecCase).m_height,(this->super_Texture3DSpecCase).m_depth,0,
             local_e0.format,local_e0.dataType,
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

void createTexture (void)
	{
		glu::TransferFormat		transferFmt		= glu::getTransferFormat(m_texFormat);
		int						pixelSize		= m_texFormat.getPixelSize();
		int						rowLength		= m_rowLength > 0 ? m_rowLength : m_width;
		int						rowPitch		= deAlign32(rowLength*pixelSize, m_alignment);
		int						imageHeight		= m_imageHeight > 0 ? m_imageHeight : m_height;
		int						slicePitch		= imageHeight*rowPitch;
		deUint32				tex				= 0;
		vector<deUint8>			data;

		DE_ASSERT(m_numLevels == 1);

		// Fill data with grid.
		data.resize(pixelSize * m_skipPixels + rowPitch * m_skipRows + slicePitch * (m_skipImages + m_depth));
		{
			Vec4	cScale		= m_texFormatInfo.valueMax-m_texFormatInfo.valueMin;
			Vec4	cBias		= m_texFormatInfo.valueMin;
			Vec4	colorA		= Vec4(1.0f, 0.0f, 0.0f, 1.0f)*cScale + cBias;
			Vec4	colorB		= Vec4(0.0f, 1.0f, 0.0f, 1.0f)*cScale + cBias;

			tcu::fillWithGrid(tcu::PixelBufferAccess(m_texFormat, m_width, m_height, m_depth, rowPitch, slicePitch, &data[0] + m_skipImages*slicePitch + m_skipRows*rowPitch + m_skipPixels*pixelSize), 4, colorA, colorB);
		}

		glPixelStorei(GL_UNPACK_IMAGE_HEIGHT,	m_imageHeight);
		glPixelStorei(GL_UNPACK_ROW_LENGTH,		m_rowLength);
		glPixelStorei(GL_UNPACK_SKIP_IMAGES,	m_skipImages);
		glPixelStorei(GL_UNPACK_SKIP_ROWS,		m_skipRows);
		glPixelStorei(GL_UNPACK_SKIP_PIXELS,	m_skipPixels);
		glPixelStorei(GL_UNPACK_ALIGNMENT,		m_alignment);

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_3D, tex);
		glTexImage3D(GL_TEXTURE_3D, 0, m_internalFormat, m_width, m_height, m_depth, 0, transferFmt.format, transferFmt.dataType, &data[0]);
	}